

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O0

Promise<void> __thiscall
capnp::Request<capnp::DynamicStruct,_capnp::DynamicStruct>::sendStreaming
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this)

{
  bool bVar1;
  RequestHook *pRVar2;
  long in_RSI;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this_local;
  Promise<void> *promise;
  
  f.exception._6_1_ = StructSchema::isStreamResult((StructSchema *)(in_RSI + 0x40));
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    pRVar2 = kj::Own<capnp::RequestHook,_std::nullptr_t>::operator->
                       ((Own<capnp::RequestHook,_std::nullptr_t> *)(in_RSI + 0x30));
    (*pRVar2->_vptr_RequestHook[1])(this);
    kj::Own<capnp::RequestHook,_std::nullptr_t>::operator=
              ((Own<capnp::RequestHook,_std::nullptr_t> *)(in_RSI + 0x30),(void *)0x0);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
             ,0x67,FAILED,"resultSchema.isStreamResult()","_kjCondition,",
             (DebugExpression<bool> *)((long)&f.exception + 7));
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

kj::Promise<void> Request<DynamicStruct, DynamicStruct>::sendStreaming() {
  KJ_REQUIRE(resultSchema.isStreamResult());

  auto promise = hook->sendStreaming();
  hook = nullptr;  // prevent reuse
  return promise;
}